

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O0

OledBitmap<128,_64> * __thiscall SSD1306::OledI2C::getBitmap(OledI2C *this)

{
  uint uVar1;
  OledBitmap<128,_64> *in_RSI;
  OledBitmap<128,_64> *in_RDI;
  OledPoint p;
  int x;
  int y;
  OledBitmap<128,_64> *bitmap;
  OledBitmap<128,_64> *in_stack_ffffffffffffffc8;
  OledPoint in_stack_ffffffffffffffd0;
  Point<int> local_24;
  int local_1c;
  int local_18;
  undefined1 local_11;
  
  local_11 = 0;
  OledBitmap<128,_64>::OledBitmap(in_RSI);
  for (local_18 = 0; local_18 < 0x40; local_18 = local_18 + 1) {
    for (local_1c = 0; local_1c < 0x80; local_1c = local_1c + 1) {
      Point<int>::Point(&local_24,local_1c,local_18);
      uVar1 = (*(in_RSI->super_OledPixel)._vptr_OledPixel[10])(in_RSI,local_24);
      if ((uVar1 & 1) != 0) {
        OledBitmap<128,_64>::setPixel(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
      }
    }
  }
  return in_RDI;
}

Assistant:

SSD1306::OledBitmap<SSD1306::OledI2C::Width, SSD1306::OledI2C::Height>
SSD1306::OledI2C::getBitmap() const
{
    OledBitmap<Width, Height> bitmap;

    for (auto y = 0 ; y < Height ; ++y)
    {
        for (auto x = 0 ; x < Width ; ++x)
        {
            OledPoint p{x, y};

            if (isSetPixel(p))
            {
                bitmap.setPixel(p);
            }
        }
    }

    return bitmap;
}